

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowAspectRatio(GLFWwindow *handle,int numer,int denom)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (((in_ESI == 0xffffffff) || (in_EDX == 0xffffffff)) ||
          ((0 < (int)in_ESI && (0 < (int)in_EDX)))) {
    *(uint *)(in_RDI + 0x60) = in_ESI;
    *(uint *)(in_RDI + 100) = in_EDX;
    if ((*(long *)(in_RDI + 0x40) == 0) && (*(int *)(in_RDI + 8) != 0)) {
      _glfwPlatformSetWindowAspectRatio
                ((_GLFWwindow *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
  }
  else {
    _glfwInputError(0x10004,"Invalid window aspect ratio %i:%i",(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowAspectRatio(GLFWwindow* handle, int numer, int denom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(numer != 0);
    assert(denom != 0);

    _GLFW_REQUIRE_INIT();

    if (numer != GLFW_DONT_CARE && denom != GLFW_DONT_CARE)
    {
        if (numer <= 0 || denom <= 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window aspect ratio %i:%i",
                            numer, denom);
            return;
        }
    }

    window->numer = numer;
    window->denom = denom;

    if (window->monitor || !window->resizable)
        return;

    _glfwPlatformSetWindowAspectRatio(window, numer, denom);
}